

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O0

Value * __thiscall Json::Value::resolveReference(Value *this,char *key,char *end)

{
  const_iterator __position;
  bool bVar1;
  iterator this_00;
  reference ppVar2;
  int in_EDX;
  char *in_RSI;
  Value *in_RDI;
  Value *value;
  value_type defaultValue;
  iterator it;
  CZString actualKey;
  ostringstream oss;
  Value *in_stack_fffffffffffffd58;
  pair<const_Json::Value::CZString,_Json::Value> *__x;
  __enable_if_t<is_constructible<value_type,_pair<const_CZString,_Value>_&>::value,_iterator>
  in_stack_fffffffffffffd60;
  undefined4 in_stack_fffffffffffffd68;
  ValueType in_stack_fffffffffffffd6c;
  ValueType VVar3;
  Value *in_stack_fffffffffffffd70;
  Value *__y;
  pair<const_Json::Value::CZString,_Json::Value> *in_stack_fffffffffffffd80;
  _Rb_tree_const_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_> local_260;
  _Base_ptr local_258;
  undefined4 local_214;
  _Self local_210;
  _Self local_208;
  undefined1 local_200 [56];
  string local_1c8 [48];
  ostringstream local_198 [376];
  int local_20;
  char *local_18;
  Value *local_8;
  
  if (((*(ushort *)&in_RDI->field_0x8 & 0xff) != 0) && ((*(ushort *)&in_RDI->field_0x8 & 0xff) != 7)
     ) {
    std::__cxx11::ostringstream::ostringstream(local_198);
    std::operator<<((ostream *)local_198,
                    "in Json::Value::resolveReference(key, end): requires objectValue");
    std::__cxx11::ostringstream::str();
    throwLogicError((string *)in_stack_fffffffffffffd70);
    std::__cxx11::string::~string(local_1c8);
    abort();
  }
  local_18 = in_RSI;
  local_20 = in_EDX;
  if ((*(ushort *)&in_RDI->field_0x8 & 0xff) == 0) {
    in_stack_fffffffffffffd80 = (pair<const_Json::Value::CZString,_Json::Value> *)(local_200 + 0x10)
    ;
    Value(in_stack_fffffffffffffd70,in_stack_fffffffffffffd6c);
    operator=((Value *)in_stack_fffffffffffffd60._M_node,in_stack_fffffffffffffd58);
    ~Value(in_RDI);
  }
  __y = (Value *)local_200;
  CZString::CZString((CZString *)__y,local_18,local_20 - (int)local_18,duplicateOnCopy);
  this_00 = std::
            map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
            ::lower_bound((map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
                           *)in_stack_fffffffffffffd58,(key_type *)0x1617fd);
  local_208._M_node = this_00._M_node;
  local_210._M_node =
       (_Base_ptr)
       std::
       map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
       ::end((map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
              *)in_stack_fffffffffffffd58);
  bVar1 = std::operator!=(&local_208,&local_210);
  VVar3 = in_stack_fffffffffffffd6c & 0xffffff;
  if (bVar1) {
    std::_Rb_tree_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_>::operator*
              ((_Rb_tree_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_> *)0x161857);
    bVar1 = CZString::operator==((CZString *)this_00._M_node,(CZString *)__y);
    VVar3 = CONCAT13(bVar1,(int3)VVar3);
  }
  if ((char)(VVar3 >> 0x18) == '\0') {
    std::pair<const_Json::Value::CZString,_Json::Value>::pair<Json::Value::CZString_&,_true>
              (in_stack_fffffffffffffd80,(CZString *)this_00._M_node,__y);
    __x = (pair<const_Json::Value::CZString,_Json::Value> *)(in_RDI->value_).map_;
    std::_Rb_tree_const_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_>::
    _Rb_tree_const_iterator(&local_260,&local_208);
    __position._M_node._4_4_ = VVar3;
    __position._M_node._0_4_ = in_stack_fffffffffffffd68;
    in_stack_fffffffffffffd60 =
         std::
         map<Json::Value::CZString,Json::Value,std::less<Json::Value::CZString>,std::allocator<std::pair<Json::Value::CZString_const,Json::Value>>>
         ::insert<std::pair<Json::Value::CZString_const,Json::Value>&>
                   (in_stack_fffffffffffffd60._M_node,__position,__x);
    local_258 = in_stack_fffffffffffffd60._M_node;
    local_208._M_node = in_stack_fffffffffffffd60._M_node;
    ppVar2 = std::_Rb_tree_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_>::operator*
                       ((_Rb_tree_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_> *)
                        0x16192e);
    local_8 = &ppVar2->second;
    local_214 = 1;
    std::pair<const_Json::Value::CZString,_Json::Value>::~pair
              ((pair<const_Json::Value::CZString,_Json::Value> *)in_stack_fffffffffffffd60._M_node);
  }
  else {
    ppVar2 = std::_Rb_tree_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_>::operator*
                       ((_Rb_tree_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_> *)
                        0x161882);
    local_8 = &ppVar2->second;
    local_214 = 1;
  }
  CZString::~CZString((CZString *)in_stack_fffffffffffffd60._M_node);
  return local_8;
}

Assistant:

Value& Value::resolveReference(char const* key, char const* end)
{
  JSON_ASSERT_MESSAGE(
      type_ == nullValue || type_ == objectValue,
      "in Json::Value::resolveReference(key, end): requires objectValue");
  if (type_ == nullValue)
    *this = Value(objectValue);
  CZString actualKey(
      key, static_cast<unsigned>(end-key), CZString::duplicateOnCopy);
  ObjectValues::iterator it = value_.map_->lower_bound(actualKey);
  if (it != value_.map_->end() && (*it).first == actualKey)
    return (*it).second;

  ObjectValues::value_type defaultValue(actualKey, nullRef);
  it = value_.map_->insert(it, defaultValue);
  Value& value = (*it).second;
  return value;
}